

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::invalid_write_built_in_constants
               (NegativeTestContext *ctx)

{
  RenderContext *pRVar1;
  bool bVar2;
  ContextType ctxType;
  mapped_type *pmVar3;
  ProgramSources *pPVar4;
  ShaderType shaderType;
  ShaderType shaderType_00;
  ShaderType shaderType_01;
  ShaderType shaderType_02;
  ShaderType shaderType_03;
  ShaderType shaderType_04;
  allocator<char> local_6f1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  ShaderProgram vertProgram;
  ShaderProgram fragProgram;
  ShaderProgram tessCtrlProgram;
  ComputeSource computeSource;
  GeometrySource geometrySource;
  TessellationEvaluationSource tessEvalSource;
  TessellationControlSource tessCtrlSource;
  FragmentSource fragSource;
  VertexSource vertSource;
  ProgramSources local_360;
  ShaderProgram computeProgram;
  ShaderProgram geometryProgram;
  ShaderProgram tessEvalProgram;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &args._M_t._M_impl.super__Rb_tree_header._M_header;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  args._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  args._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       args._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertProgram,"GLSL_VERSION_STRING",(allocator<char> *)&fragProgram);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&vertProgram);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&vertProgram);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertProgram,"GLSL_TESS_EXTENSION_STRING",(allocator<char> *)&fragProgram);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&vertProgram);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&vertProgram);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertProgram,"COMPUTE_BUILT_IN_CONSTANTS_STRING",
             (allocator<char> *)&fragProgram);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&args,(key_type *)&vertProgram);
  std::__cxx11::string::assign((char *)pmVar3);
  std::__cxx11::string::~string((string *)&vertProgram);
  (anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)&tessCtrlProgram,(_anonymous_namespace_ *)0x0,shaderType);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&fragProgram,(string *)&tessCtrlProgram);
  tcu::StringTemplate::specialize((string *)&vertProgram,(StringTemplate *)&fragProgram,&args);
  glu::VertexSource::VertexSource(&vertSource,(string *)&vertProgram);
  std::__cxx11::string::~string((string *)&vertProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragProgram);
  std::__cxx11::string::~string((string *)&tessCtrlProgram);
  (anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)&tessCtrlProgram,(_anonymous_namespace_ *)0x1,shaderType_00);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&fragProgram,(string *)&tessCtrlProgram);
  tcu::StringTemplate::specialize((string *)&vertProgram,(StringTemplate *)&fragProgram,&args);
  glu::FragmentSource::FragmentSource(&fragSource,(string *)&vertProgram);
  std::__cxx11::string::~string((string *)&vertProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragProgram);
  std::__cxx11::string::~string((string *)&tessCtrlProgram);
  (anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)&tessCtrlProgram,(_anonymous_namespace_ *)0x3,shaderType_01);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&fragProgram,(string *)&tessCtrlProgram);
  tcu::StringTemplate::specialize((string *)&vertProgram,(StringTemplate *)&fragProgram,&args);
  glu::TessellationControlSource::TessellationControlSource(&tessCtrlSource,(string *)&vertProgram);
  std::__cxx11::string::~string((string *)&vertProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragProgram);
  std::__cxx11::string::~string((string *)&tessCtrlProgram);
  (anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)&tessCtrlProgram,(_anonymous_namespace_ *)0x4,shaderType_02);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&fragProgram,(string *)&tessCtrlProgram);
  tcu::StringTemplate::specialize((string *)&vertProgram,(StringTemplate *)&fragProgram,&args);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            (&tessEvalSource,(string *)&vertProgram);
  std::__cxx11::string::~string((string *)&vertProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragProgram);
  std::__cxx11::string::~string((string *)&tessCtrlProgram);
  (anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)&tessCtrlProgram,(_anonymous_namespace_ *)0x2,shaderType_03);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&fragProgram,(string *)&tessCtrlProgram);
  tcu::StringTemplate::specialize((string *)&vertProgram,(StringTemplate *)&fragProgram,&args);
  glu::GeometrySource::GeometrySource(&geometrySource,(string *)&vertProgram);
  std::__cxx11::string::~string((string *)&vertProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragProgram);
  std::__cxx11::string::~string((string *)&tessCtrlProgram);
  (anonymous_namespace)::genBuiltInSource_abi_cxx11_
            ((string *)&tessCtrlProgram,(_anonymous_namespace_ *)0x5,shaderType_04);
  tcu::StringTemplate::StringTemplate((StringTemplate *)&fragProgram,(string *)&tessCtrlProgram);
  tcu::StringTemplate::specialize((string *)&vertProgram,(StringTemplate *)&fragProgram,&args);
  glu::ComputeSource::ComputeSource(&computeSource,(string *)&vertProgram);
  std::__cxx11::string::~string((string *)&vertProgram);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)&fragProgram);
  std::__cxx11::string::~string((string *)&tessCtrlProgram);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&fragProgram,0,0xac);
  fragProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  fragProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  fragProgram.m_program.m_info.linkOk = false;
  fragProgram.m_program.m_info._33_7_ = 0;
  fragProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  pPVar4 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&fragProgram,&vertSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&vertProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&fragProgram);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&tessCtrlProgram,0,0xac);
  tessCtrlProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  tessCtrlProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  tessCtrlProgram.m_program.m_info.linkOk = false;
  tessCtrlProgram.m_program.m_info._33_7_ = 0;
  tessCtrlProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  pPVar4 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&tessCtrlProgram,&fragSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&fragProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&tessCtrlProgram);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&tessEvalProgram,0,0xac);
  tessEvalProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  tessEvalProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  tessEvalProgram.m_program.m_info.linkOk = false;
  tessEvalProgram.m_program.m_info._33_7_ = 0;
  tessEvalProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  pPVar4 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&tessEvalProgram,&tessCtrlSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&tessCtrlProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&tessEvalProgram);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&geometryProgram,0,0xac);
  geometryProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  geometryProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  geometryProgram.m_program.m_info.linkOk = false;
  geometryProgram.m_program.m_info._33_7_ = 0;
  geometryProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  pPVar4 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&geometryProgram,&tessEvalSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&tessEvalProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&geometryProgram);
  pRVar1 = ctx->m_renderCtx;
  memset((ProgramSources *)&computeProgram,0,0xac);
  computeProgram.m_program.m_info.infoLog.field_2._M_allocated_capacity = 0;
  computeProgram.m_program.m_info.infoLog.field_2._8_8_ = 0;
  computeProgram.m_program.m_info.linkOk = false;
  computeProgram.m_program.m_info._33_7_ = 0;
  computeProgram.m_program.m_info.linkTimeUs._0_1_ = 1;
  pPVar4 = glu::ProgramSources::operator<<
                     ((ProgramSources *)&computeProgram,&geometrySource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&geometryProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&computeProgram);
  pRVar1 = ctx->m_renderCtx;
  memset(&local_360,0,0xac);
  local_360.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_360.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_360.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_360.separable = true;
  pPVar4 = glu::ProgramSources::operator<<(&local_360,&computeSource.super_ShaderSource);
  glu::ShaderProgram::ShaderProgram(&computeProgram,pRVar1,pPVar4);
  glu::ProgramSources::~ProgramSources(&local_360);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,
             "A compile time is generated if compute built-in constants provided in all shaders are written to."
             ,&local_6f1);
  NegativeTestContext::beginSection(ctx,(string *)&local_360);
  std::__cxx11::string::~string((string *)&local_360);
  verifyCompileError(ctx,&vertProgram,SHADERTYPE_VERTEX);
  verifyCompileError(ctx,&fragProgram,SHADERTYPE_FRAGMENT);
  verifyCompileError(ctx,&tessCtrlProgram,SHADERTYPE_TESSELLATION_CONTROL);
  verifyCompileError(ctx,&tessEvalProgram,SHADERTYPE_TESSELLATION_EVALUATION);
  verifyCompileError(ctx,&geometryProgram,SHADERTYPE_GEOMETRY);
  verifyCompileError(ctx,&computeProgram,SHADERTYPE_COMPUTE);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram(&computeProgram);
  glu::ShaderProgram::~ShaderProgram(&geometryProgram);
  glu::ShaderProgram::~ShaderProgram(&tessEvalProgram);
  glu::ShaderProgram::~ShaderProgram(&tessCtrlProgram);
  glu::ShaderProgram::~ShaderProgram(&fragProgram);
  glu::ShaderProgram::~ShaderProgram(&vertProgram);
  std::__cxx11::string::~string((string *)&computeSource.super_ShaderSource.source);
  std::__cxx11::string::~string((string *)&geometrySource.super_ShaderSource.source);
  std::__cxx11::string::~string((string *)&tessEvalSource.super_ShaderSource.source);
  std::__cxx11::string::~string((string *)&tessCtrlSource.super_ShaderSource.source);
  std::__cxx11::string::~string((string *)&fragSource.super_ShaderSource.source);
  std::__cxx11::string::~string((string *)&vertSource.super_ShaderSource.source);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&args._M_t);
  return;
}

Assistant:

void invalid_write_built_in_constants (NegativeTestContext& ctx)
{
	const bool					isES32			= glu::contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	map<string, string>			args;

	args["GLSL_VERSION_STRING"]					=	isES32 ? getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES);
	args["GLSL_TESS_EXTENSION_STRING"]			=	isES32 ? "" : "#extension GL_EXT_tessellation_shader : require";
	args["COMPUTE_BUILT_IN_CONSTANTS_STRING"]	=	"	gl_MaxComputeWorkGroupCount       = ivec3(65535, 65535, 65535);\n"
													"	gl_MaxComputeWorkGroupCount       = ivec3(1024, 1024, 64);\n"
													"	gl_MaxComputeWorkGroupSize        = ivec3(512);\n"
													"	gl_MaxComputeUniformComponents    = 512;\n"
													"	gl_MaxComputeTextureImageUnits    = 16;\n"
													"	gl_MaxComputeImageUniforms        = 8;\n"
													"	gl_MaxComputeAtomicCounters       = 8;\n"
													"	gl_MaxComputeAtomicCounterBuffers = 1;\n";

	const glu::VertexSource					vertSource		(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_VERTEX)).specialize(args));
	const glu::FragmentSource				fragSource		(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_FRAGMENT)).specialize(args));
	const glu::TessellationControlSource	tessCtrlSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_TESSELLATION_CONTROL)).specialize(args));
	const glu::TessellationEvaluationSource	tessEvalSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_TESSELLATION_EVALUATION)).specialize(args));
	const glu::GeometrySource				geometrySource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_GEOMETRY)).specialize(args));
	const glu::ComputeSource				computeSource	(tcu::StringTemplate(genBuiltInSource(glu::SHADERTYPE_COMPUTE)).specialize(args));

	glu::ShaderProgram	vertProgram		(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << vertSource);
	glu::ShaderProgram	fragProgram		(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << fragSource);
	glu::ShaderProgram	tessCtrlProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessCtrlSource);
	glu::ShaderProgram	tessEvalProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << tessEvalSource);
	glu::ShaderProgram	geometryProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << geometrySource);
	glu::ShaderProgram	computeProgram	(ctx.getRenderContext(), glu::ProgramSources() << glu::ProgramSeparable(true) << computeSource);

	ctx.beginSection("A compile time is generated if compute built-in constants provided in all shaders are written to.");
	verifyCompileError(ctx, vertProgram, glu::SHADERTYPE_VERTEX);
	verifyCompileError(ctx, fragProgram, glu::SHADERTYPE_FRAGMENT);
	verifyCompileError(ctx, tessCtrlProgram, glu::SHADERTYPE_TESSELLATION_CONTROL);
	verifyCompileError(ctx, tessEvalProgram, glu::SHADERTYPE_TESSELLATION_EVALUATION);
	verifyCompileError(ctx, geometryProgram, glu::SHADERTYPE_GEOMETRY);
	verifyCompileError(ctx, computeProgram, glu::SHADERTYPE_COMPUTE);
	ctx.endSection();
}